

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * roaring::Roaring64Map::bitmapOf(size_t n,...)

{
  uint uVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  Roaring64Map *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t i;
  va_list vl;
  Roaring64Map *ans;
  Roaring64Map *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  ulong local_40;
  uint local_38 [2];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 local_11;
  ulong local_10;
  Roaring64Map *local_8;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_11 = 0;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Roaring64Map(in_stack_fffffffffffffed0);
  local_28 = local_108;
  local_30 = &stack0x00000008;
  local_38[1] = 0x30;
  local_38[0] = 0x10;
  for (local_40 = 0; uVar1 = local_38[0], local_40 < local_10; local_40 = local_40 + 1) {
    if (local_38[0] < 0x29) {
      local_38[0] = local_38[0] + 8;
    }
    else {
      local_30 = local_30 + 8;
    }
    add((Roaring64Map *)CONCAT44(uVar1,in_stack_fffffffffffffee0),(uint64_t)local_38);
  }
  return in_RDI;
}

Assistant:

static Roaring64Map bitmapOf(size_t n...) {
        Roaring64Map ans;
        va_list vl;
        va_start(vl, n);
        for (size_t i = 0; i < n; i++) {
            ans.add(va_arg(vl, uint64_t));
        }
        va_end(vl);
        return ans;
    }